

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator
fmt::v9::detail::write_codepoint<8ul,char,fmt::v9::detail::counting_iterator>
          (counting_iterator out,char prefix,uint32_t cp)

{
  counting_iterator cVar1;
  uint in_EDX;
  char in_SIL;
  char buf [8];
  counting_iterator *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  char value;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  value_type local_2b;
  char local_2a [2];
  counting_iterator local_28;
  value_type local_1a;
  char local_19;
  uint local_18;
  char local_11;
  
  value = (char)((ulong)in_stack_ffffffffffffffb0 >> 0x38);
  local_19 = '\\';
  local_18 = in_EDX;
  local_11 = in_SIL;
  local_28 = counting_iterator::operator++(in_stack_ffffffffffffffa8,0);
  counting_iterator::operator*(&local_28);
  counting_iterator::value_type::operator=(&local_1a,&local_19);
  local_2a[0] = local_11;
  cVar1 = counting_iterator::operator++(in_stack_ffffffffffffffa8,0);
  counting_iterator::operator*((counting_iterator *)&stack0xffffffffffffffc8);
  counting_iterator::value_type::operator=(&local_2b,local_2a);
  fill_n<char,unsigned_long>
            (in_stack_ffffffffffffffc0,(unsigned_long)in_stack_ffffffffffffffb8,value);
  format_uint<4u,char,unsigned_int>(&stack0xffffffffffffffbf,local_18,8,false);
  cVar1 = copy_str<char,char*,fmt::v9::detail::counting_iterator>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,cVar1);
  return (counting_iterator)cVar1.count_;
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_uint<4>(buf, cp, width);
  return copy_str<Char>(buf, buf + width, out);
}